

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fUniformLocationTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::UniformLocationTests::~UniformLocationTests(UniformLocationTests *this)

{
  StructType *this_00;
  pointer ppSVar1;
  long lVar2;
  
  (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__UniformLocationTests_00b512f0;
  ppSVar1 = (this->structTypes).
            super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->structTypes).
                              super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar1) >> 3)) {
    lVar2 = 0;
    do {
      this_00 = ppSVar1[lVar2];
      if (this_00 != (StructType *)0x0) {
        glu::StructType::~StructType(this_00);
        operator_delete(this_00,0x38);
      }
      lVar2 = lVar2 + 1;
      ppSVar1 = (this->structTypes).
                super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (lVar2 < (int)((ulong)((long)(this->structTypes).
                                         super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar1)
                          >> 3));
  }
  if (ppSVar1 != (pointer)0x0) {
    operator_delete(ppSVar1,(long)(this->structTypes).
                                  super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppSVar1
                   );
  }
  tcu::TestCase::~TestCase((TestCase *)this);
  return;
}

Assistant:

UniformLocationTests::~UniformLocationTests (void)
{
	for (int i = 0; i < int(structTypes.size()); i++)
		delete structTypes[i];
}